

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  size_t __n;
  pointer ppVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  pointer pbVar3;
  int iVar4;
  int iVar5;
  PolicyStatus PVar6;
  string *psVar7;
  ostream *poVar8;
  cmake *pcVar9;
  char *pcVar10;
  _Rb_tree_node_base *p_Var11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  LinkLibraryVectorType *pLVar13;
  string *psVar14;
  PolicyID id;
  pointer item;
  undefined1 *puVar15;
  uint uVar16;
  bool bVar17;
  cmStringRange cVar18;
  cmBacktraceRange cVar19;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  ostringstream e;
  cmGeneratorExpression local_340;
  undefined4 local_330;
  MessageType local_32c;
  string local_328;
  cmOptionalLinkImplementation *local_300;
  string local_2f8;
  cmListFileBacktrace *local_2d8;
  string *local_2d0;
  cmListFileBacktrace local_2c8;
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_278;
  string *local_270;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  cmGeneratorTarget *local_260;
  PolicyMap *local_258;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1f8;
  undefined8 local_1b8;
  undefined1 local_1a8 [8];
  _Base_ptr local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  ios_base local_138 [264];
  
  local_300 = impl;
  local_260 = head;
  cVar18 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar19 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_2d8 = (cmListFileBacktrace *)cVar19.Begin._M_current;
  if (cVar18.Begin._M_current._M_current != cVar18.End._M_current._M_current) {
    local_258 = &this->PolicyMap;
    local_250 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_278 = &this->MaxLanguageStandards;
    local_270 = config;
    do {
      local_268 = cVar18.End._M_current;
      local_340.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cVar18.Begin._M_current;
      local_298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_298.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.field_2._8_6_ = 0x534549524152;
      local_2b8.field_2._M_allocated_capacity._0_6_ = 0x4c5f4b4e494c;
      local_2b8.field_2._M_allocated_capacity._6_2_ = 0x4249;
      local_2b8._M_string_length = 0xe;
      local_2b8.field_2._M_local_buf[0xe] = '\0';
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_228,this,&local_2b8,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                                 local_2b8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      local_2c8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_2d8->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_2c8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (local_2d8->TopEntry).
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_2c8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2c8.TopEntry.
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_2c8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2c8.TopEntry.
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_2c8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_238,&local_2c8);
      if (local_2c8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c8.TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      cmGeneratorExpression::Parse(&local_340,(string *)local_238);
      local_1a0 = (_Base_ptr)0x0;
      local_198[0]._M_local_buf[0] = '\0';
      local_1a8 = (undefined1  [8])local_198;
      local_2d0 = cmCompiledGeneratorExpression::Evaluate
                            ((cmCompiledGeneratorExpression *)
                             local_340.Backtrace.TopEntry.
                             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,this->LocalGenerator,config,false,local_260,
                             (cmGeneratorExpressionDAGChecker *)local_228,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                 local_198[0]._M_local_buf[0]) + 1);
      }
      cmSystemTools::ExpandListArgument(local_2d0,&local_298,false);
      pbVar3 = local_298.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar14 = local_298.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(bool *)((long)local_340.Backtrace.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x131) == true) {
        local_300->HadHeadSensitiveCondition = true;
      }
      for (; psVar14 != pbVar3; psVar14 = psVar14 + 1) {
        CheckCMP0004(&local_2f8,this,psVar14);
        psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_2f8._M_string_length ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            psVar7->_M_string_length) {
          if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2f8._M_string_length !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
             (iVar4 = bcmp(local_2f8._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,
                           local_2f8._M_string_length), iVar4 != 0)) goto LAB_0034f12f;
LAB_0034f054:
          psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
          iVar4 = 6;
          if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2f8._M_string_length ==
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               psVar7->_M_string_length) &&
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2f8._M_string_length ==
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
              (iVar5 = bcmp(local_2f8._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,
                            local_2f8._M_string_length), iVar5 == 0)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            PVar6 = cmPolicies::PolicyMap::Get(local_258,CMP0038);
            if (PVar6 != OLD) {
              if (PVar6 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_328,(cmPolicies *)0x26,id);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_328._M_dataplus._M_p,
                                    local_328._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  local_328.field_2._M_allocated_capacity + 1);
                }
                local_330 = 0;
                local_32c = AUTHOR_WARNING;
              }
              else {
                local_32c = FATAL_ERROR;
                local_330 = (undefined4)CONCAT71((uint7)(uint3)(PVar6 >> 8),1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                                  psVar7->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" links to itself.",0x12);
              pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
              std::__cxx11::stringbuf::str();
              GetBacktrace((cmGeneratorTarget *)local_248);
              cmake::IssueMessage(pcVar9,local_32c,&local_328,(cmListFileBacktrace *)local_248);
              if ((cmMakefile *)local_248._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((char)local_330 != '\0') {
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                iVar4 = 1;
                goto LAB_0034f2fa;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
LAB_0034f2fa:
          bVar17 = false;
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_2f8._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          goto LAB_0034f054;
LAB_0034f12f:
          ResolveLinkItem((cmLinkItem *)local_1a8,this,&local_2f8,local_2d8);
          __n = local_2d0->_M_string_length;
          bVar17 = true;
          if (__n == *(size_t *)
                      &(local_340.Backtrace.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count) {
            if (__n == 0) {
              bVar17 = false;
            }
            else {
              iVar4 = bcmp((local_2d0->_M_dataplus)._M_p,
                           ((_Alloc_hider *)
                           &(local_340.Backtrace.TopEntry.
                             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_vptr__Sp_counted_base)->_M_p,__n);
              bVar17 = iVar4 != 0;
            }
          }
          local_328._M_dataplus._M_p._0_1_ = bVar17;
          std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::emplace_back<cmLinkItem,bool>
                    ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)local_300,
                     (cmLinkItem *)local_1a8,(bool *)&local_328);
          if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
          }
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                     local_198[0]._M_local_buf[0]) + 1);
          }
          iVar4 = 0;
          bVar17 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((iVar4 != 6) && (iVar4 != 0)) goto LAB_0034f3a7;
      }
      psVar2 = &((cmCompiledGeneratorExpression *)
                local_340.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->SeenTargetProperties;
      for (p_Var11 = (((cmCompiledGeneratorExpression *)
                      local_340.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var11 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        pcVar10 = GetProperty(this,(string *)(p_Var11 + 1));
        if (pcVar10 == (char *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var11 + 1));
        }
      }
      bVar17 = true;
      cmCompiledGeneratorExpression::GetMaxLanguageStandard
                ((cmCompiledGeneratorExpression *)
                 local_340.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,this,local_278);
LAB_0034f3a7:
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_340);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_238);
      config = local_270;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._16_8_ != &local_208) {
        operator_delete((void *)local_228._16_8_,local_208._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_298);
      if (!bVar17) {
        return;
      }
      local_2d8 = local_2d8 + 1;
      cVar18.End._M_current = local_268._M_current;
      cVar18.Begin._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_340.Backtrace.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 2);
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_340.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 2) != local_268._M_current);
  }
  local_268 = cVar18.End._M_current;
  local_340.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cVar18.Begin._M_current;
  pcVar9 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2f8,pcVar9);
  if (config->_M_string_length == 0) {
    uVar16 = 2;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_1a8,config);
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (local_2f8._M_dataplus._M_p,local_2f8._M_string_length,local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
    uVar16 = (_Var12._M_current ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2f8._M_string_length) + 1;
  }
  pLVar13 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
  item = (pLVar13->
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (pLVar13->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (item != ppVar1) {
    local_300 = (cmOptionalLinkImplementation *)
                &(local_300->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item->second & ~uVar16) != GENERAL_LibraryType) {
        CheckCMP0004((string *)local_228,this,&item->first);
        psVar14 = cmTarget::GetName_abi_cxx11_(this->Target);
        puVar15 = (undefined1 *)local_228._0_8_;
        if (local_228._8_8_ == psVar14->_M_string_length) {
          if ((local_228._8_8_ != 0) &&
             (iVar4 = bcmp((void *)local_228._0_8_,(psVar14->_M_dataplus)._M_p,local_228._8_8_),
             iVar4 != 0)) goto LAB_0034f553;
LAB_0034f5e1:
          if (puVar15 == local_228 + 0x10) goto LAB_0034f601;
        }
        else {
          if (local_228._8_8_ == 0) goto LAB_0034f5e1;
LAB_0034f553:
          local_328._M_dataplus._M_p = (char *)0x0;
          local_328._M_string_length = 0;
          ResolveLinkItem((cmLinkItem *)local_1a8,this,(string *)local_228,
                          (cmListFileBacktrace *)&local_328);
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_300,
                     (cmLinkItem *)local_1a8);
          if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
          }
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                     local_198[0]._M_local_buf[0]) + 1);
          }
          puVar15 = (undefined1 *)local_228._0_8_;
          if ((undefined1 *)local_228._0_8_ == local_228 + 0x10) goto LAB_0034f601;
        }
        operator_delete(puVar15,(ulong)(local_228._16_8_ + 1));
      }
LAB_0034f601:
      item = item + 1;
    } while (item != ppVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange = this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange = this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
                                     end = entryRange.end();
       le != end; ++le, ++btIt) {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_LIBRARIES", nullptr,
                                               nullptr);
    cmGeneratorExpression ge(*btIt);
    std::unique_ptr<cmCompiledGeneratorExpression> const cge = ge.Parse(*le);
    std::string const& evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }

    for (std::string const& lib : llibs) {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(lib);
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          MessageType messageType = MessageType::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == MessageType::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      impl.Libraries.emplace_back(this->ResolveLinkItem(name, *btIt),
                                  evaluated != *le);
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::string const& sp : seenProps) {
      if (!this->GetProperty(sp)) {
        this->LinkImplicitNullProperties.insert(sp);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LibraryID const& oldllib : oldllibs) {
    if (oldllib.second != GENERAL_LibraryType && oldllib.second != linkType) {
      std::string name = this->CheckCMP0004(oldllib.first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        this->ResolveLinkItem(name, cmListFileBacktrace()));
    }
  }
}